

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeToPDFForm.cpp
# Opt level: O3

int MergeToPDFForm(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  EStatusCode EVar3;
  EncryptionOptions *pEVar4;
  PDFPage *this;
  PDFParsingOptions *inOptions;
  PDFDocumentCopyingContext *this_00;
  PDFFormXObject *this_01;
  XObjectContentContext *this_02;
  ObjectIDType inFormXObjectID;
  PageContentContext *inPageContext;
  ResourcesDictionary *this_03;
  uint uVar5;
  string formName;
  PDFWriter pdfWriter;
  string local_1040;
  string local_1020;
  undefined1 local_1000 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fe0;
  _Alloc_hider local_fc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fb8;
  undefined1 local_fa0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f88;
  string local_f70;
  string local_f50;
  undefined1 local_f30 [8];
  _Alloc_hider local_f28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f18;
  longlong local_f08;
  _Alloc_hider local_f00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ef0;
  PDFWriter local_ee0;
  
  PDFWriter::PDFWriter(&local_ee0);
  paVar1 = &local_1040.field_2;
  local_1040._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1040,"MergeToPDFForm.pdf","");
  BuildRelativeOutputPath(&local_1020,(char **)argv[2],&local_1040);
  local_f70._M_dataplus._M_p = (pointer)&local_f70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f70,"MergeToPDFForm.txt","");
  BuildRelativeOutputPath(&local_f50,(char **)argv[2],&local_f70);
  LogConfiguration::LogConfiguration((LogConfiguration *)local_fa0,true,true,&local_f50);
  pEVar4 = EncryptionOptions::DefaultEncryptionOptions();
  local_f30[0] = pEVar4->ShouldEncrypt;
  pcVar2 = (pEVar4->UserPassword)._M_dataplus._M_p;
  local_f28._M_p = (pointer)&local_f18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f28,pcVar2,pcVar2 + (pEVar4->UserPassword)._M_string_length);
  local_f08 = pEVar4->UserProtectionOptionsFlag;
  pcVar2 = (pEVar4->OwnerPassword)._M_dataplus._M_p;
  local_f00._M_p = (pointer)&local_ef0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f00,pcVar2,pcVar2 + (pEVar4->OwnerPassword)._M_string_length);
  PDFCreationSettings::PDFCreationSettings
            ((PDFCreationSettings *)local_1000,true,true,(EncryptionOptions *)local_f30,false);
  EVar3 = PDFWriter::StartPDF(&local_ee0,&local_1020,ePDFVersion13,(LogConfiguration *)local_fa0,
                              (PDFCreationSettings *)local_1000);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fc8._M_p != &local_fb8) {
    operator_delete(local_fc8._M_p,local_fb8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1000._16_8_ != &local_fe0) {
    operator_delete((void *)local_1000._16_8_,local_fe0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_p != &local_ef0) {
    operator_delete(local_f00._M_p,local_ef0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f28._M_p != &local_f18) {
    operator_delete(local_f28._M_p,local_f18._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa0._8_8_ != &local_f88) {
    operator_delete((void *)local_fa0._8_8_,local_f88._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f50._M_dataplus._M_p != &local_f50.field_2) {
    operator_delete(local_f50._M_dataplus._M_p,local_f50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f70._M_dataplus._M_p != &local_f70.field_2) {
    operator_delete(local_f70._M_dataplus._M_p,local_f70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1020._M_dataplus._M_p != &local_1020.field_2) {
    operator_delete(local_1020._M_dataplus._M_p,local_1020.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1040._M_dataplus._M_p != paVar1) {
    operator_delete(local_1040._M_dataplus._M_p,local_1040.field_2._M_allocated_capacity + 1);
  }
  if (EVar3 == eSuccess) {
    this = (PDFPage *)operator_new(0x2b8);
    PDFPage::PDFPage(this);
    PDFRectangle::PDFRectangle((PDFRectangle *)local_1000,0.0,0.0,595.0,842.0);
    PDFPage::SetMediaBox(this,(PDFRectangle *)local_1000);
    PDFRectangle::~PDFRectangle((PDFRectangle *)local_1000);
    local_1040._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1040,"Linearized.pdf","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_fa0,argv[1],(allocator<char> *)&local_f50);
    LocalPathToFileURL((FileURL *)local_1000,(string *)local_fa0);
    RelativeURLToLocalPath(&local_1020,(FileURL *)local_1000,&local_1040);
    FileURL::~FileURL((FileURL *)local_1000);
    if ((undefined1 *)local_fa0._0_8_ != local_fa0 + 0x10) {
      operator_delete((void *)local_fa0._0_8_,local_fa0._16_8_ + 1);
    }
    inOptions = PDFParsingOptions::DefaultPDFParsingOptions();
    this_00 = PDFWriter::CreatePDFCopyingContext(&local_ee0,&local_1020,inOptions);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1020._M_dataplus._M_p != &local_1020.field_2) {
      operator_delete(local_1020._M_dataplus._M_p,local_1020.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1040._M_dataplus._M_p != paVar1) {
      operator_delete(local_1040._M_dataplus._M_p,local_1040.field_2._M_allocated_capacity + 1);
    }
    PDFRectangle::PDFRectangle((PDFRectangle *)local_1000,0.0,0.0,297.5,842.0);
    this_01 = PDFWriter::StartFormXObject(&local_ee0,(PDFRectangle *)local_1000,(double *)0x0);
    PDFRectangle::~PDFRectangle((PDFRectangle *)local_1000);
    uVar5 = 1;
    if (this_01 != (PDFFormXObject *)0x0) {
      this_02 = PDFFormXObject::GetContentContext(this_01);
      AbstractContentContext::q(&this_02->super_AbstractContentContext);
      AbstractContentContext::cm(&this_02->super_AbstractContentContext,0.5,0.0,0.0,0.5,0.0,0.0);
      EVar3 = PDFDocumentCopyingContext::MergePDFPageToFormXObject(this_00,this_01,1);
      if (EVar3 == eSuccess) {
        AbstractContentContext::Q(&this_02->super_AbstractContentContext);
        AbstractContentContext::q(&this_02->super_AbstractContentContext);
        AbstractContentContext::cm(&this_02->super_AbstractContentContext,0.5,0.0,0.0,0.5,0.0,421.0)
        ;
        EVar3 = PDFDocumentCopyingContext::MergePDFPageToFormXObject(this_00,this_01,0);
        if (EVar3 == eSuccess) {
          AbstractContentContext::Q(&this_02->super_AbstractContentContext);
          inFormXObjectID = PDFFormXObject::GetObjectID(this_01);
          EVar3 = PDFWriter::EndFormXObjectAndRelease(&local_ee0,this_01);
          if (EVar3 == eSuccess) {
            inPageContext = PDFWriter::StartPageContentContext(&local_ee0,this);
            this_03 = PDFPage::GetResourcesDictionary(this);
            ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_
                      ((string *)local_1000,this_03,inFormXObjectID);
            AbstractContentContext::q(&inPageContext->super_AbstractContentContext);
            AbstractContentContext::Do
                      (&inPageContext->super_AbstractContentContext,(string *)local_1000);
            AbstractContentContext::cm
                      (&inPageContext->super_AbstractContentContext,1.0,0.0,0.0,1.0,297.5,0.0);
            AbstractContentContext::Do
                      (&inPageContext->super_AbstractContentContext,(string *)local_1000);
            AbstractContentContext::Q(&inPageContext->super_AbstractContentContext);
            EVar3 = PDFWriter::EndPageContentContext(&local_ee0,inPageContext);
            uVar5 = 1;
            if (EVar3 == eSuccess) {
              EVar3 = PDFWriter::WritePageAndRelease(&local_ee0,this);
              if (EVar3 == eSuccess) {
                EVar3 = PDFWriter::EndPDF(&local_ee0);
                uVar5 = (uint)(EVar3 != eSuccess);
              }
            }
            if ((undefined1 *)local_1000._0_8_ != local_1000 + 0x10) {
              operator_delete((void *)local_1000._0_8_,(ulong)(local_1000._16_8_ + 1));
            }
          }
        }
      }
    }
    if (this_00 != (PDFDocumentCopyingContext *)0x0) {
      PDFDocumentCopyingContext::~PDFDocumentCopyingContext(this_00);
      goto LAB_001417e8;
    }
  }
  else {
    uVar5 = 1;
  }
  this_00 = (PDFDocumentCopyingContext *)0x0;
LAB_001417e8:
  operator_delete(this_00,0xd0);
  PDFWriter::~PDFWriter(&local_ee0);
  return uVar5;
}

Assistant:

int MergeToPDFForm(int argc, char* argv[])
{
	PDFWriter pdfWriter;
	EStatusCode status;
    PDFDocumentCopyingContext* copyingContext = NULL;
    
	do
	{
		status = pdfWriter.StartPDF(BuildRelativeOutputPath(argv,"MergeToPDFForm.pdf"),
                                    ePDFVersion13,
                                    LogConfiguration(true,true,BuildRelativeOutputPath(argv,"MergeToPDFForm.txt")));
		if(status != PDFHummus::eSuccess)
			break;
        
        
        // in this test we will merge 2 pages into a PDF form, and place it twice, forming a 2X2 design. amazing.
        
		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));
        
        
        copyingContext = pdfWriter.CreatePDFCopyingContext(BuildRelativeInputPath(argv,"Linearized.pdf"));
        if(status != PDFHummus::eSuccess)
            break;
        
        // create form for two pages.
        PDFFormXObject* newFormXObject = pdfWriter.StartFormXObject(PDFRectangle(0,0,297.5,842));
        if(!newFormXObject)
        {
            status = PDFHummus::eFailure;
            break;
        }
        
		XObjectContentContext* xobjectContentContext = newFormXObject->GetContentContext();
        
        xobjectContentContext->q();
        xobjectContentContext->cm(0.5,0,0,0.5,0,0);
        status = copyingContext->MergePDFPageToFormXObject(newFormXObject,1);
        if(status != eSuccess)
            break;
        xobjectContentContext->Q();
        
        xobjectContentContext->q();
        xobjectContentContext->cm(0.5,0,0,0.5,0,421);
        status = copyingContext->MergePDFPageToFormXObject(newFormXObject,0);
        if(status != eSuccess)
            break;
        xobjectContentContext->Q();
        
        ObjectIDType formID = newFormXObject->GetObjectID();
        status = pdfWriter.EndFormXObjectAndRelease(newFormXObject);
        if(status != eSuccess)
            break;
        
        // now place it in the page
        PageContentContext* pageContentContext = pdfWriter.StartPageContentContext(page);
        
        
        string formName = page->GetResourcesDictionary().AddFormXObjectMapping(formID);
  
        pageContentContext->q();
        pageContentContext->Do(formName);
        pageContentContext->cm(1,0,0,1,297.5,0);
        pageContentContext->Do(formName);
        pageContentContext->Q();
        
        status = pdfWriter.EndPageContentContext(pageContentContext);
        if(status != eSuccess)
            break;
        
		status = pdfWriter.WritePageAndRelease(page);
		if(status != PDFHummus::eSuccess)
			break;
        
		status = pdfWriter.EndPDF();
		if(status != PDFHummus::eSuccess)
			break;
	}while(false);
    
    delete copyingContext;
	
	return status == eSuccess ? 0:1;
}